

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O3

void __thiscall CVmObjLookupTable::save_to_file(CVmObjLookupTable *this,CVmFile *fp)

{
  uint *puVar1;
  uint16_t tmp;
  int iVar2;
  char *__s1;
  long lVar3;
  vm_val_t *val;
  uint uVar4;
  char buf [12];
  short local_46;
  short local_44 [2];
  char local_3f [5];
  short local_3a;
  uint *local_38;
  
  puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  local_44[0] = (short)*puVar1;
  CVmFile::write_bytes(fp,(char *)local_44,2);
  local_44[0] = (short)puVar1[1];
  CVmFile::write_bytes(fp,(char *)local_44,2);
  if (*(long *)(puVar1 + 2) == 0) {
    local_44[0] = 0;
  }
  else {
    local_44[0] = (short)(((int)*(long *)(puVar1 + 2) - ((int)puVar1 + *puVar1 * 8)) - 0x20 >> 3) *
                  -0x3333 + 1;
  }
  CVmFile::write_bytes(fp,(char *)local_44,2);
  __s1 = CVmObject::get_image_file_version((CVmObject *)this);
  iVar2 = strcmp(__s1,"030003");
  if (-1 < iVar2) {
    vmb_put_dh((char *)local_44,(vm_val_t *)(puVar1 + 4));
    CVmFile::write_bytes(fp,(char *)local_44,5);
  }
  uVar4 = *puVar1;
  local_38 = puVar1 + 8;
  if (uVar4 != 0) {
    lVar3 = 0;
    do {
      if (*(long *)(puVar1 + lVar3 * 2 + 8) == 0) {
        local_46 = 0;
      }
      else {
        local_46 = (short)((int)*(long *)(puVar1 + lVar3 * 2 + 8) - ((int)local_38 + *puVar1 * 8) >>
                          3) * -0x3333 + 1;
      }
      CVmFile::write_bytes(fp,(char *)&local_46,2);
      lVar3 = lVar3 + 1;
    } while (uVar4 != (uint)lVar3);
  }
  uVar4 = puVar1[1];
  if (uVar4 != 0) {
    val = (vm_val_t *)(local_38 + (ulong)*puVar1 * 2);
    do {
      vmb_put_dh((char *)local_44,val);
      vmb_put_dh(local_3f,val + 1);
      if (*(long *)(val + 2) == 0) {
        local_3a = 0;
      }
      else {
        local_3a = (short)((int)*(long *)(val + 2) - ((int)local_38 + *puVar1 * 8) >> 3) * -0x3333 +
                   1;
      }
      CVmFile::write_bytes(fp,(char *)local_44,0xc);
      val = (vm_val_t *)&val[2].val;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void CVmObjLookupTable::save_to_file(VMG_ class CVmFile *fp)
{
    vm_lookup_ext *ext = get_ext();
    uint i;
    vm_lookup_val **bp;
    vm_lookup_val *val;
    char buf[VMLOOKUP_VALUE_SIZE];

    /* write our bucket count, value count, and first-free index */
    fp->write_uint2(ext->bucket_cnt);
    fp->write_uint2(ext->value_cnt);
    fp->write_uint2(ext->val_to_img_idx(ext->first_free));

    /*
     *   If the image file was compiled for version 030003 or later of the
     *   LookupTable object, save the default value.  The default value
     *   wasn't added until 030003, so source code compiled against earlier
     *   versions of the metaclass spec can't change it from the 'nil'
     *   default.  Furthermore, these image files could be loaded on VMs that
     *   have older versions of the metaclass that won't know to look for a
     *   default value in the loaded data, so to be compatible with those
     *   readers we must omit the value entirely.  If the image file was
     *   compiled with 030003 or later, it can only be loaded by VMs with
     *   LookupTable implementations that know to read the value.  
     */
    if (image_file_version_ge(vmg_ "030003"))
    {
        vmb_put_dh(buf, &ext->default_value);
        fp->write_bytes(buf, VMB_DATAHOLDER);
    }

    /* write the buckets */
    for (i = ext->bucket_cnt, bp = ext->buckets ; i != 0 ; --i, ++bp)
        fp->write_uint2(ext->val_to_img_idx(*bp));

    /* write the values */
    for (i = ext->value_cnt, val = ext->idx_to_val(0) ; i != 0 ; --i, ++val)
    {
        uint idx;
        
        /* store the key, value, and index */
        vmb_put_dh(buf, &val->key);
        vmb_put_dh(buf + VMB_DATAHOLDER, &val->val);
        idx = ext->val_to_img_idx(val->nxt);
        oswp2(buf + VMB_DATAHOLDER*2, idx);

        /* write the data */
        fp->write_bytes(buf, VMLOOKUP_VALUE_SIZE);
    }
}